

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void destroy_face(FT_Memory memory,FT_Face face,FT_Driver driver)

{
  FT_Driver_Class pFVar1;
  FT_Generic_Finalizer p_Var2;
  FT_ListNode pFVar3;
  FT_Face_DoneFunc p_Var4;
  FT_Stream pFVar5;
  FT_Long FVar6;
  FT_Memory pFVar7;
  FT_ListNode pFVar8;
  
  pFVar1 = driver->clazz;
  p_Var2 = (face->autohint).finalizer;
  if (p_Var2 != (FT_Generic_Finalizer)0x0) {
    (*p_Var2)((face->autohint).data);
  }
  while (face->glyph != (FT_GlyphSlot)0x0) {
    FT_Done_GlyphSlot(face->glyph);
  }
  if (memory != (FT_Memory)0x0) {
    pFVar8 = (face->sizes_list).head;
    while (pFVar8 != (FT_ListNode)0x0) {
      pFVar3 = pFVar8->next;
      destroy_size(memory,(FT_Size)pFVar8->data,driver);
      (*memory->free)(memory,pFVar8);
      pFVar8 = pFVar3;
    }
    (face->sizes_list).head = (FT_ListNode)0x0;
    (face->sizes_list).tail = (FT_ListNode)0x0;
  }
  face->size = (FT_Size)0x0;
  p_Var2 = (face->generic).finalizer;
  if (p_Var2 != (FT_Generic_Finalizer)0x0) {
    (*p_Var2)(face);
  }
  destroy_charmaps(face,memory);
  p_Var4 = pFVar1->done_face;
  if (p_Var4 != (FT_Face_DoneFunc)0x0) {
    (*p_Var4)(face);
  }
  pFVar5 = face->stream;
  if (pFVar5 != (FT_Stream)0x0) {
    FVar6 = face->face_flags;
    pFVar7 = pFVar5->memory;
    if (pFVar5->close != (FT_Stream_CloseFunc)0x0) {
      (*pFVar5->close)(pFVar5);
    }
    if (((uint)FVar6 >> 10 & 1) == 0) {
      (*pFVar7->free)(pFVar7,pFVar5);
    }
  }
  face->stream = (FT_Stream)0x0;
  if (face->internal != (FT_Face_Internal)0x0) {
    (*memory->free)(memory,face->internal);
    face->internal = (FT_Face_Internal)0x0;
  }
  if (face == (FT_Face)0x0) {
    return;
  }
  (*memory->free)(memory,face);
  return;
}

Assistant:

static void
  destroy_face( FT_Memory  memory,
                FT_Face    face,
                FT_Driver  driver )
  {
    FT_Driver_Class  clazz = driver->clazz;


    /* discard auto-hinting data */
    if ( face->autohint.finalizer )
      face->autohint.finalizer( face->autohint.data );

    /* Discard glyph slots for this face.                           */
    /* Beware!  FT_Done_GlyphSlot() changes the field `face->glyph' */
    while ( face->glyph )
      FT_Done_GlyphSlot( face->glyph );

    /* discard all sizes for this face */
    FT_List_Finalize( &face->sizes_list,
                      (FT_List_Destructor)destroy_size,
                      memory,
                      driver );
    face->size = NULL;

    /* now discard client data */
    if ( face->generic.finalizer )
      face->generic.finalizer( face );

    /* discard charmaps */
    destroy_charmaps( face, memory );

    /* finalize format-specific stuff */
    if ( clazz->done_face )
      clazz->done_face( face );

    /* close the stream for this face if needed */
    FT_Stream_Free(
      face->stream,
      ( face->face_flags & FT_FACE_FLAG_EXTERNAL_STREAM ) != 0 );

    face->stream = NULL;

    /* get rid of it */
    if ( face->internal )
    {
      FT_FREE( face->internal );
    }
    FT_FREE( face );
  }